

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimetypeparser.cpp
# Opt level: O2

void __thiscall QMimeTypeXMLData::clear(QMimeTypeXMLData *this)

{
  this->hasGlobDeleteAll = false;
  QString::clear(&this->name);
  QHash<QString,_QString>::clear(&this->localeComments);
  QString::clear(&this->genericIconName);
  QString::clear(&this->iconName);
  QList<QString>::clear(&this->globPatterns);
  return;
}

Assistant:

void QMimeTypeXMLData::clear()
{
    hasGlobDeleteAll = false;
    name.clear();
    localeComments.clear();
    genericIconName.clear();
    iconName.clear();
    globPatterns.clear();
}